

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

void tokenize(list *list,char *func)

{
  byte bVar1;
  char ch;
  _Bool _Var2;
  uint uVar3;
  size_t sVar4;
  TOKEN_TYPE TVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  
  current_type = T_None;
  current_token = (char *)malloc_(1);
  *current_token = '\0';
  lVar7 = 0;
  uVar8 = 0;
  do {
    lVar6 = lVar7 >> 0x20;
    bVar1 = func[lVar6];
    if ((bVar1 != 0x20) && (bVar1 != 0x2c)) {
      if (((current_type == T_None) &&
          (current_type = T_Operand, bVar1 != 0x2e && 9 < (byte)(bVar1 - 0x30))) &&
         ((0x3d < bVar1 - 0x21 ||
          (current_type = T_Operator,
          (0x2000000010005781U >> ((ulong)(bVar1 - 0x21) & 0x3f) & 1) == 0)))) {
        current_type = T_None - ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a);
      }
      bVar1 = func[lVar6];
      TVar5 = T_Operand;
      if ((9 < (byte)(bVar1 - 0x30) && bVar1 != 0x2e) &&
         ((0x3d < bVar1 - 0x21 ||
          (TVar5 = T_Operator, (0x2000000010005781U >> ((ulong)(bVar1 - 0x21) & 0x3f) & 1) == 0))))
      {
        TVar5 = T_None - ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a);
      }
      if (TVar5 != current_type || current_type == T_Operator) {
        addToken(list,current_token);
        free(current_token);
        current_token = (char *)malloc_(1);
        *current_token = '\0';
        bVar1 = func[lVar6];
        current_type = T_Operand;
        if ((9 < (byte)(bVar1 - 0x30) && bVar1 != 0x2e) &&
           ((0x3d < bVar1 - 0x21 ||
            (current_type = T_Operator,
            (0x2000000010005781U >> ((ulong)(bVar1 - 0x21) & 0x3f) & 1) == 0)))) {
          current_type = T_None - ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a);
        }
      }
      ch = func[lVar6];
      if (((ch != '-') && (ch != '+')) ||
         ((0 < (int)(uint)uVar8 &&
          ((((bVar1 = func[(ulong)((uint)uVar8 & 0x7fffffff) - 1],
             (byte)(bVar1 - 0x30) < 10 || bVar1 == 0x2e || (uVar3 = bVar1 - 0x28, 0x36 < uVar3)) ||
            ((0x400000002000adU >> ((ulong)uVar3 & 0x3f) & 1) == 0)) ||
           ((list->last != (token *)0x0 && (_Var2 = isNumber(list->last->value), _Var2)))))))) {
        appendChar(&current_token,ch);
      }
      else {
        current_type = T_Operand;
        free(current_token);
        current_token = (char *)malloc_(2);
        *current_token = func[lVar6];
        current_token[1] = '\0';
      }
    }
    uVar8 = uVar8 + 1;
    sVar4 = strlen(func);
    lVar7 = lVar7 + 0x100000000;
  } while (uVar8 <= sVar4);
  if (*current_token != '\0') {
    addToken(list,current_token);
  }
  free(current_token);
  return;
}

Assistant:

void tokenize(struct list *list, const char *func)
{
    size_t i;

    current_type = T_None;
    current_token = malloc_(1);
    current_token[0] = '\0';

    for (i = 0; i <= strlen(func); i++) {
        processChar(list, func, i);
    }

    if (strlen(current_token) > 0) {
        addToken(list, current_token);
    }

    free(current_token);
}